

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_helper.cpp
# Opt level: O2

void Unit_Test::fillImage
               (Image *image,uint32_t x,uint32_t y,uint32_t width,uint32_t height,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *value)

{
  uchar *puVar1;
  byte bVar2;
  uint uVar3;
  pointer puVar4;
  pointer puVar5;
  long lVar6;
  ulong uVar7;
  uchar *puVar8;
  uchar *puVar9;
  
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (image,x,y,width,height);
  uVar3 = image->_rowSize;
  bVar2 = image->_colorCount;
  puVar4 = (value->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  lVar6 = 0;
  puVar5 = (value->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar9 = image->_data + (ulong)(x * bVar2) + (ulong)(y * uVar3);
  puVar8 = puVar9 + height * uVar3;
  for (; puVar9 != puVar8; puVar9 = puVar9 + uVar3) {
    for (uVar7 = 0; bVar2 * width != uVar7; uVar7 = uVar7 + 1) {
      puVar1 = (value->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start + lVar6;
      lVar6 = lVar6 + 1;
      puVar9[uVar7] = *puVar1;
      if (lVar6 == (long)puVar4 - (long)puVar5) {
        lVar6 = 0;
      }
    }
  }
  return;
}

Assistant:

void fillImage( PenguinV_Image::Image & image, uint32_t x, uint32_t y, uint32_t width, uint32_t height,
                    const std::vector < uint8_t > & value )
    {
        Image_Function::ParameterValidation( image, x, y, width, height );

        const uint32_t rowSize = image.rowSize();
        uint8_t * outputY      = image.data() + y * rowSize + x * image.colorCount();
        const uint8_t * endY   = outputY + rowSize * height;

        width = width * image.colorCount();
        const size_t valueSize = value.size();

        size_t id = 0;

        for ( ; outputY != endY; outputY += rowSize ) {
            uint8_t * outputX    = outputY;
            const uint8_t * endX = outputX + width;

            for( ; outputX != endX; ++outputX ) {
                (*outputX) = value[id++];
                if ( id == valueSize )
                    id = 0;
            }
        }
    }